

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_put.c
# Opt level: O0

int allwrite(_func_int_varargs *op,int fd,char *buf,uint len)

{
  int iVar1;
  int *piVar2;
  uint local_2c;
  int w;
  uint len_local;
  char *buf_local;
  int fd_local;
  _func_int_varargs *op_local;
  
  local_2c = len;
  _w = buf;
  do {
    while( true ) {
      if (local_2c == 0) {
        return 0;
      }
      iVar1 = (*op)((ulong)(uint)fd,_w,(ulong)local_2c);
      if (iVar1 == -1) break;
      if (iVar1 == 0) {
        return -1;
      }
      _w = _w + iVar1;
      local_2c = local_2c - iVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == error_intr);
  return -1;
}

Assistant:

static int allwrite(int (*op)(),int fd,const char *buf,unsigned int len)
{
  int w;

  while (len) {
    w = op(fd,buf,len);
    if (w == -1) {
      if (errno == error_intr) continue;
      return -1; /* note that some data may have been written */
    }
//TODO: probably meant as a return -1??? a break????    
	if (w == 0) 
		return -1; /* luser's fault */
    buf += w;
    len -= w;
  }
  return 0;
}